

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O0

ShaderSourceFileData *
Diligent::ReadShaderSourceFile
          (ShaderSourceFileData *__return_storage_ptr__,char *SourceCode,size_t SourceLength,
          IShaderSourceInputStreamFactory *pShaderSourceStreamFactory,char *FilePath)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  Char *pCVar4;
  IFileStream **ppIVar5;
  IFileStream *pIVar6;
  IDataBlob *pIVar7;
  char *pcVar8;
  undefined4 extraout_var;
  IFileStream *local_f8;
  undefined1 local_e0 [8];
  string msg_2;
  string msg_1;
  undefined1 local_98 [16];
  DoublePtrHelper<Diligent::IFileStream> local_88;
  RefCntAutoPtr<Diligent::IFileStream> local_78;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  undefined1 local_58 [8];
  string msg;
  char *local_30;
  char *FilePath_local;
  IShaderSourceInputStreamFactory *pShaderSourceStreamFactory_local;
  size_t SourceLength_local;
  char *SourceCode_local;
  ShaderSourceFileData *SourceData;
  
  msg.field_2._M_local_buf[0xf] = '\0';
  local_30 = FilePath;
  FilePath_local = (char *)pShaderSourceStreamFactory;
  pShaderSourceStreamFactory_local = (IShaderSourceInputStreamFactory *)SourceLength;
  SourceLength_local = (size_t)SourceCode;
  SourceCode_local = (char *)__return_storage_ptr__;
  ShaderSourceFileData::ShaderSourceFileData(__return_storage_ptr__);
  if (SourceLength_local == 0) {
    if (FilePath_local == (char *)0x0) {
      FormatString<char[29]>((string *)local_e0,(char (*) [29])"Input stream factory is null");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0x101);
      std::__cxx11::string::~string((string *)local_e0);
    }
    else if (local_30 == (char *)0x0) {
      FormatString<char[17]>((string *)((long)&msg_2.field_2 + 8),(char (*) [17])"FilePath is null")
      ;
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0xfc);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    else {
      RefCntAutoPtr<Diligent::IFileStream>::RefCntAutoPtr(&local_78);
      pcVar1 = FilePath_local;
      pcVar8 = local_30;
      RefCntAutoPtr<Diligent::IFileStream>::operator&
                ((RefCntAutoPtr<Diligent::IFileStream> *)(local_98 + 0x10));
      ppIVar5 = RefCntAutoPtr::DoublePtrHelper::operator_cast_to_IFileStream__
                          ((DoublePtrHelper *)(local_98 + 0x10));
      (**(code **)(*(long *)pcVar1 + 0x20))(pcVar1,pcVar8,ppIVar5);
      RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
                ((DoublePtrHelper<Diligent::IFileStream> *)(local_98 + 0x10));
      pIVar6 = RefCntAutoPtr::operator_cast_to_IFileStream_((RefCntAutoPtr *)&local_78);
      if (pIVar6 == (IFileStream *)0x0) {
        local_98[0xf] = 0x27;
        LogError<true,char[36],char_const*,char>
                  (false,"ReadShaderSourceFile",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                   ,0xf3,(char (*) [36])"Failed to load shader source file \'",&local_30,
                   local_98 + 0xf);
      }
      DataBlobImpl::Create((DataBlobImpl *)local_98,0,(void *)0x0);
      RefCntAutoPtr<Diligent::IDataBlob>::operator=
                (&__return_storage_ptr__->pFileData,
                 (RefCntAutoPtr<Diligent::DataBlobImpl> *)local_98);
      RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
                ((RefCntAutoPtr<Diligent::DataBlobImpl> *)local_98);
      pIVar6 = RefCntAutoPtr<Diligent::IFileStream>::operator->(&local_78);
      pIVar7 = RefCntAutoPtr::operator_cast_to_IDataBlob_((RefCntAutoPtr *)__return_storage_ptr__);
      (*(pIVar6->super_IObject)._vptr_IObject[5])(pIVar6,pIVar7);
      pIVar7 = RefCntAutoPtr<Diligent::IDataBlob>::operator->(&__return_storage_ptr__->pFileData);
      pcVar8 = IDataBlob::GetConstDataPtr<char>(pIVar7,0);
      __return_storage_ptr__->Source = pcVar8;
      pIVar7 = RefCntAutoPtr<Diligent::IDataBlob>::operator->(&__return_storage_ptr__->pFileData);
      iVar3 = (*(pIVar7->super_IObject)._vptr_IObject[5])();
      msg_1.field_2._8_8_ = CONCAT44(extraout_var,iVar3);
      uVar2 = StaticCast<unsigned_int,unsigned_long>
                        ((unsigned_long *)(msg_1.field_2._M_local_buf + 8));
      __return_storage_ptr__->SourceLength = uVar2;
      RefCntAutoPtr<Diligent::IFileStream>::~RefCntAutoPtr(&local_78);
    }
  }
  else {
    if (local_30 != (char *)0x0) {
      FormatString<char[50]>
                ((string *)local_58,
                 (char (*) [50])"FilePath must be null when SourceCode is not null");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"ReadShaderSourceFile",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/ShaderToolsCommon.cpp"
                 ,0xe6);
      std::__cxx11::string::~string((string *)local_58);
    }
    __return_storage_ptr__->Source = (char *)SourceLength_local;
    if (pShaderSourceStreamFactory_local == (IShaderSourceInputStreamFactory *)0x0) {
      local_f8 = (IFileStream *)strlen((char *)SourceLength_local);
    }
    else {
      local_f8 = (IFileStream *)pShaderSourceStreamFactory_local;
    }
    pSourceStream.m_pObject = local_f8;
    uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&pSourceStream);
    __return_storage_ptr__->SourceLength = uVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

ShaderSourceFileData ReadShaderSourceFile(const char*                      SourceCode,
                                          size_t                           SourceLength,
                                          IShaderSourceInputStreamFactory* pShaderSourceStreamFactory,
                                          const char*                      FilePath) noexcept(false)
{
    ShaderSourceFileData SourceData;
    if (SourceCode != nullptr)
    {
        VERIFY(FilePath == nullptr, "FilePath must be null when SourceCode is not null");
        SourceData.Source       = SourceCode;
        SourceData.SourceLength = StaticCast<Uint32>(SourceLength != 0 ? SourceLength : strlen(SourceCode));
    }
    else
    {
        if (pShaderSourceStreamFactory != nullptr)
        {
            if (FilePath != nullptr)
            {
                RefCntAutoPtr<IFileStream> pSourceStream;
                pShaderSourceStreamFactory->CreateInputStream(FilePath, &pSourceStream);
                if (pSourceStream == nullptr)
                    LOG_ERROR_AND_THROW("Failed to load shader source file '", FilePath, '\'');

                SourceData.pFileData = DataBlobImpl::Create();
                pSourceStream->ReadBlob(SourceData.pFileData);
                SourceData.Source       = SourceData.pFileData->GetConstDataPtr<char>();
                SourceData.SourceLength = StaticCast<Uint32>(SourceData.pFileData->GetSize());
            }
            else
            {
                UNEXPECTED("FilePath is null");
            }
        }
        else
        {
            UNEXPECTED("Input stream factory is null");
        }
    }

    return SourceData;
}